

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_enclosing_tet(REF_GRID ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  double dVar1;
  double dVar2;
  REF_CELL ref_cell;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  undefined8 uVar7;
  char *pcVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  REF_INT nodes [27];
  uint local_cc;
  REF_DBL *local_c8;
  REF_DBL *local_c0;
  REF_GRID local_b8;
  REF_NODE local_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  
  local_b0 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  local_cc = *tet;
  uVar9 = ref_cell->max;
  if ((int)local_cc < (int)uVar9 && -1 < (int)local_cc) {
    if (ref_cell->c2n[(long)ref_cell->size_per * (long)(int)local_cc] != -1) goto LAB_0015837f;
LAB_00158357:
    piVar6 = ref_cell->c2n;
    uVar5 = 0;
    do {
      if (*piVar6 != -1) goto LAB_0015837b;
      uVar5 = uVar5 + 1;
      piVar6 = piVar6 + ref_cell->size_per;
    } while (uVar9 != uVar5);
    uVar5 = (ulong)uVar9;
  }
  else {
    if (0 < (int)uVar9) goto LAB_00158357;
    uVar5 = 0;
  }
LAB_0015837b:
  local_cc = (uint)uVar5;
LAB_0015837f:
  uVar9 = 0;
  local_c8 = (REF_DBL *)tet;
  local_c0 = xyz;
  local_b8 = ref_grid;
  do {
    uVar3 = local_cc;
    if ((((long)(int)local_cc < 0) || (ref_cell->max <= (int)local_cc)) ||
       (ref_cell->c2n[(long)ref_cell->size_per * (long)(int)local_cc] == -1)) {
      uVar4 = ref_grid_exhaustive_enclosing_tet
                        ((REF_GRID)local_b8->node,(REF_DBL *)local_b8->cell[8],(REF_INT *)local_c0,
                         local_c8);
      if (uVar4 == 0) goto LAB_0015876a;
      pcVar8 = "enclose";
      uVar7 = 0x39f;
      goto LAB_001588b6;
    }
    uVar4 = ref_cell_nodes(ref_cell,local_cc,&local_a8);
    if (uVar4 != 0) {
      pcVar8 = "cell";
      uVar7 = 0x3a3;
      goto LAB_001588b6;
    }
    uVar4 = ref_node_bary4(local_b0,&local_a8,local_c0,bary);
    if ((uVar4 & 0xfffffffb) != 0) {
      pcVar8 = "bary";
      uVar7 = 0x3a4;
      goto LAB_001588b6;
    }
    if (0x3de < uVar9) {
      printf("step %d, tet %d, bary %e %e %e %e inside %e\n",*bary,bary[1],bary[2],bary[3],
             0xbd719799812dea11,(ulong)uVar9,(ulong)uVar3);
    }
    dVar1 = *bary;
    dVar2 = bary[1];
    if (((-1e-12 <= dVar1) && (-1e-12 <= dVar2)) && ((-1e-12 <= bary[2] && (-1e-12 <= bary[3])))) {
      *(uint *)local_c8 = uVar3;
      goto LAB_0015876a;
    }
    if (((dVar2 <= dVar1) || (bary[2] <= dVar1)) || (bary[3] <= dVar1)) {
      if (dVar1 <= dVar2) {
        dVar10 = bary[2];
        dVar11 = bary[3];
      }
      else {
        dVar10 = bary[2];
        dVar11 = bary[3];
        if ((dVar2 < dVar11) && (dVar2 < dVar10)) {
          uVar4 = ref_update_tet_guess(ref_cell,local_a8,local_9c,local_a0,(REF_INT *)&local_cc);
          if (uVar4 == 0) goto LAB_00158637;
          pcVar8 = "update 0 3 2";
          uVar7 = 0x3ba;
          goto LAB_001588b6;
        }
      }
      if (((dVar1 <= dVar10) || (dVar2 <= dVar10)) || (dVar11 <= dVar10)) {
        if (((dVar2 <= dVar11) || (dVar1 <= dVar11)) || (dVar10 <= dVar11)) {
          if (((dVar2 < dVar1) || (dVar10 < dVar1)) || (dVar11 < dVar1)) {
            if (((dVar10 < dVar2) || (dVar1 < dVar2)) || (dVar11 < dVar2)) {
              if (((dVar1 < dVar10) || (dVar2 < dVar10)) || (dVar11 < dVar10)) {
                if (((dVar2 < dVar11) || (dVar1 < dVar11)) || (dVar10 < dVar11)) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x3e3,"ref_grid_enclosing_tet","unable to find the next step");
                  return 1;
                }
                uVar4 = ref_update_tet_guess
                                  (ref_cell,local_a8,local_a0,local_a4,(REF_INT *)&local_cc);
                if (uVar4 != 0) {
                  pcVar8 = "update 0 2 1";
                  uVar7 = 0x3df;
                  goto LAB_001588b6;
                }
              }
              else {
                uVar4 = ref_update_tet_guess
                                  (ref_cell,local_a8,local_a4,local_9c,(REF_INT *)&local_cc);
                if (uVar4 != 0) {
                  pcVar8 = "update 0 1 3";
                  uVar7 = 0x3d9;
                  goto LAB_001588b6;
                }
              }
            }
            else {
              uVar4 = ref_update_tet_guess(ref_cell,local_a8,local_9c,local_a0,(REF_INT *)&local_cc)
              ;
              if (uVar4 != 0) {
                pcVar8 = "update 0 3 2";
                uVar7 = 0x3d3;
                goto LAB_001588b6;
              }
            }
          }
          else {
            uVar4 = ref_update_tet_guess(ref_cell,local_a4,local_a0,local_9c,(REF_INT *)&local_cc);
            if (uVar4 != 0) {
              pcVar8 = "update 1 2 3";
              uVar7 = 0x3cd;
              goto LAB_001588b6;
            }
          }
        }
        else {
          uVar4 = ref_update_tet_guess(ref_cell,local_a8,local_a0,local_a4,(REF_INT *)&local_cc);
          if (uVar4 != 0) {
            pcVar8 = "update 0 2 1";
            uVar7 = 0x3c6;
            goto LAB_001588b6;
          }
        }
      }
      else {
        uVar4 = ref_update_tet_guess(ref_cell,local_a8,local_a4,local_9c,(REF_INT *)&local_cc);
        if (uVar4 != 0) {
          pcVar8 = "update 0 1 3";
          uVar7 = 0x3c0;
          goto LAB_001588b6;
        }
      }
    }
    else {
      uVar4 = ref_update_tet_guess(ref_cell,local_a4,local_a0,local_9c,(REF_INT *)&local_cc);
      if (uVar4 != 0) {
        pcVar8 = "update 1 2 3";
        uVar7 = 0x3b4;
        goto LAB_001588b6;
      }
    }
LAB_00158637:
    uVar9 = uVar9 + 1;
  } while (uVar9 != 1000);
  uVar4 = ref_grid_exhaustive_enclosing_tet
                    ((REF_GRID)local_b8->node,(REF_DBL *)local_b8->cell[8],(REF_INT *)local_c0,
                     local_c8);
  if (uVar4 == 0) {
LAB_0015876a:
    uVar4 = 0;
  }
  else {
    pcVar8 = "enclose";
    uVar7 = 999;
LAB_001588b6:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar7,
           "ref_grid_enclosing_tet",(ulong)uVar4,pcVar8);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_grid_enclosing_tet(REF_GRID ref_grid, REF_DBL *xyz,
                                          REF_INT *tet, REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess;
  REF_DBL inside;
  REF_INT step, limit;

  guess = *tet;
  if (!ref_cell_valid(ref_cell, guess)) {
    each_ref_cell_valid_cell(ref_cell, guess) { break; }
  }

  limit = 1000;      /* was 10e6^(1/3), required 108 for twod testcase  */
  inside = -1.0e-12; /* initial inside tolerance  */

  for (step = 0; step < limit; step++) {
    /* exhaustive search if cell is invalid */
    if (!ref_cell_valid(ref_cell, guess)) {
      RSS(ref_grid_exhaustive_enclosing_tet(ref_grid, xyz, tet, bary),
          "enclose");
      return REF_SUCCESS;
    }

    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");

    if (step > 990) {
      printf("step %d, tet %d, bary %e %e %e %e inside %e\n", step, guess,
             bary[0], bary[1], bary[2], bary[3], inside);
    }

    if (bary[0] >= inside && bary[1] >= inside && bary[2] >= inside &&
        bary[3] >= inside) {
      *tet = guess;
      return REF_SUCCESS;
    }

    /* less than */
    if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[1], nodes[2], nodes[3], &guess),
          "update 1 2 3");
      continue;
    }

    if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[3], nodes[2], &guess),
          "update 0 3 2");
      continue;
    }

    if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[1], nodes[3], &guess),
          "update 0 1 3");
      continue;
    }

    if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[2], nodes[1], &guess),
          "update 0 2 1");
      continue;
    }

    /* less than or equal */
    if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[1], nodes[2], nodes[3], &guess),
          "update 1 2 3");
      continue;
    }

    if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[3], nodes[2], &guess),
          "update 0 3 2");
      continue;
    }

    if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[1], nodes[3], &guess),
          "update 0 1 3");
      continue;
    }

    if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[2], nodes[1], &guess),
          "update 0 2 1");
      continue;
    }

    THROW("unable to find the next step");
  }

  /* exhaustive search when walk runs out of iterations */
  RSS(ref_grid_exhaustive_enclosing_tet(ref_grid, xyz, tet, bary), "enclose");

  return REF_SUCCESS;
}